

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.c
# Opt level: O1

int get_test_set(int *test_set,int limit,char *test,test_list_t *tests)

{
  bool bVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  long lVar4;
  int iVar5;
  int iVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  auVar3 = _DAT_00112200;
  if (test == (char *)0x0) {
    if (limit < 1) {
      return limit;
    }
    lVar4 = (ulong)(uint)limit - 1;
    auVar12._8_4_ = (int)lVar4;
    auVar12._0_8_ = lVar4;
    auVar12._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar9 = 0;
    auVar12 = auVar12 ^ _DAT_00112200;
    auVar13 = _DAT_001121f0;
    do {
      auVar14 = auVar13 ^ auVar3;
      if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                  auVar12._4_4_ < auVar14._4_4_) & 1)) {
        test_set[uVar9] = (int)uVar9;
      }
      if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
          auVar14._12_4_ <= auVar12._12_4_) {
        test_set[uVar9 + 1] = (int)uVar9 + 1;
      }
      uVar9 = uVar9 + 2;
      lVar4 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar4 + 2;
    } while ((limit + 1U & 0xfffffffe) != uVar9);
    return limit;
  }
  if (9 < (byte)(*test - 0x30U)) {
    if (0 < limit) {
      uVar9 = 0;
      uVar8 = 0;
LAB_00104fa8:
      pcVar11 = tests[uVar9].name;
      cVar7 = *test;
      pcVar10 = test + (cVar7 == '^');
      do {
        if (*pcVar10 != '\\') {
          if (*pcVar10 != '*') goto LAB_00105005;
          for (; *pcVar10 == '*'; pcVar10 = pcVar10 + 1) {
          }
          if (*pcVar10 == '\\') {
            pcVar10 = pcVar10 + 1;
          }
          pcVar11 = strchr(pcVar11,(int)*pcVar10);
          if (pcVar11 != (char *)0x0) goto LAB_00105005;
LAB_00105019:
          bVar2 = false;
          bVar1 = true;
          goto LAB_00105029;
        }
        pcVar10 = pcVar10 + 1;
LAB_00105005:
        if (*pcVar10 != *pcVar11) goto LAB_00105019;
        if (*pcVar10 == '\0') goto LAB_00105022;
        pcVar10 = pcVar10 + 1;
        pcVar11 = pcVar11 + 1;
      } while( true );
    }
    uVar8 = 0;
    goto LAB_001050ee;
  }
  cVar7 = *test;
  uVar9 = 0;
  if ((byte)(cVar7 - 0x30U) < 10) {
    iVar5 = 0;
    do {
      iVar5 = (uint)(byte)(cVar7 - 0x30) + iVar5 * 10;
      cVar7 = test[1];
      test = test + 1;
    } while ((byte)(cVar7 - 0x30U) < 10);
  }
  else {
    iVar5 = 0;
  }
  iVar6 = iVar5;
  if (cVar7 == '\0') {
LAB_001050b0:
    uVar9 = 0;
    if ((iVar5 < 0) || (limit <= iVar6)) {
      bVar1 = false;
    }
    else {
      bVar1 = false;
      if (iVar5 <= iVar6) {
        uVar9 = 0;
        do {
          test_set[uVar9] = iVar5 + (int)uVar9;
          uVar9 = uVar9 + 1;
        } while ((iVar6 - iVar5) + 1 != uVar9);
        bVar1 = true;
      }
    }
  }
  else {
    bVar1 = false;
    if (cVar7 == '-') {
      if (test[1] == '\0') {
        iVar6 = limit + -1;
      }
      else {
        cVar7 = test[1];
        iVar6 = 0;
        if ((byte)(cVar7 - 0x30U) < 10) {
          pcVar11 = test + 2;
          iVar6 = 0;
          do {
            iVar6 = (uint)(byte)(cVar7 - 0x30) + iVar6 * 10;
            cVar7 = *pcVar11;
            pcVar11 = pcVar11 + 1;
          } while ((byte)(cVar7 - 0x30U) < 10);
        }
      }
      goto LAB_001050b0;
    }
  }
  uVar8 = (uint)uVar9;
  if (!bVar1) {
    return -1;
  }
LAB_001050ee:
  return -(uint)(uVar8 == 0) | uVar8;
LAB_00105022:
  bVar2 = true;
  bVar1 = false;
LAB_00105029:
  if (cVar7 != '^') {
    bVar1 = bVar2;
  }
  if (bVar1) {
    lVar4 = (long)(int)uVar8;
    uVar8 = uVar8 + 1;
    test_set[lVar4] = (int)uVar9;
  }
  uVar9 = uVar9 + 1;
  if (uVar9 == (uint)limit) goto LAB_001050ee;
  goto LAB_00104fa8;
}

Assistant:

int get_test_set(int *test_set, int limit, const char *test,
	struct test_list_t *tests)
{
	int start, end;
	int idx = 0;

	if (test == NULL) {
		/* Default: Run all tests. */
		for (;idx < limit; idx++)
			test_set[idx] = idx;
		return (limit);
	}
	if (*test >= '0' && *test <= '9') {
		const char *vp = test;
		start = 0;
		while (*vp >= '0' && *vp <= '9') {
			start *= 10;
			start += *vp - '0';
			++vp;
		}
		if (*vp == '\0') {
			end = start;
		} else if (*vp == '-') {
			++vp;
			if (*vp == '\0') {
				end = limit - 1;
			} else {
				end = 0;
				while (*vp >= '0' && *vp <= '9') {
					end *= 10;
					end += *vp - '0';
					++vp;
				}
			}
		} else
			return (-1);
		if (start < 0 || end >= limit || start > end)
			return (-1);
		while (start <= end)
			test_set[idx++] = start++;
	} else {
		for (start = 0; start < limit; ++start) {
			const char *name = tests[start].name;
			if (test_filter(test, name))
				test_set[idx++] = start;
		}
	}
	return ((idx == 0)?-1:idx);
}